

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O0

size_t __thiscall
s2coding::EncodedUintVector<unsigned_long_long>::lower_bound<4>
          (EncodedUintVector<unsigned_long_long> *this,unsigned_long_long target)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  unsigned_long_long value;
  size_t mid;
  size_t hi;
  size_t lo;
  unsigned_long_long target_local;
  EncodedUintVector<unsigned_long_long> *this_local;
  
  hi = 0;
  uVar2 = (ulong)this->size_;
  while (mid = uVar2, hi < mid) {
    uVar2 = hi + mid >> 1;
    uVar1 = GetUintWithLength<unsigned_long_long>(this->data_ + uVar2 * 4,4);
    if (uVar1 < target) {
      hi = uVar2 + 1;
      uVar2 = mid;
    }
  }
  return hi;
}

Assistant:

inline size_t EncodedUintVector<T>::lower_bound(T target) const {
  size_t lo = 0, hi = size_;
  while (lo < hi) {
    size_t mid = (lo + hi) >> 1;
    T value = GetUintWithLength<T>(data_ + mid * length, length);
    if (value < target) {
      lo = mid + 1;
    } else {
      hi = mid;
    }
  }
  return lo;
}